

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int24_To_Int8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  byte bVar1;
  ushort uVar2;
  PaInt32 PVar3;
  byte *pbVar4;
  bool bVar5;
  
  pbVar4 = (byte *)((long)sourceBuffer + 2);
  while (bVar5 = count != 0, count = count - 1, bVar5) {
    uVar2 = *(ushort *)(pbVar4 + -2);
    bVar1 = *pbVar4;
    PVar3 = PaUtil_Generate16BitTriangularDither(ditherGenerator);
    *(char *)destinationBuffer = (char)(PVar3 + ((uint)bVar1 << 0x17 | (uint)uVar2 << 7) >> 0x17);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
    pbVar4 = pbVar4 + sourceStride * 3;
  }
  return;
}

Assistant:

static void Int24_To_Int8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    signed char  *dest = (signed char*)destinationBuffer;
    
    PaInt32 temp, dither;

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        temp = (((PaInt32)src[0]) << 8);  
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 24);
#elif defined(PA_BIG_ENDIAN)
        temp = (((PaInt32)src[0]) << 24);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 8);
#endif

        /* REVIEW */
        dither = PaUtil_Generate16BitTriangularDither( ditherGenerator );
        *dest = (signed char) (((temp >> 1) + dither) >> 23);

        src += sourceStride * 3;
        dest += destinationStride;
    }
}